

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_alloc.cpp
# Opt level: O0

void set_thr_data(kmp_info_t *th)

{
  void *__s;
  long in_RDI;
  thr_data_t *data;
  int i;
  size_t in_stack_ffffffffffffffe0;
  int local_c;
  
  if (*(long *)(in_RDI + 0x118) == 0) {
    __s = ___kmp_allocate(in_stack_ffffffffffffffe0);
  }
  else {
    __s = *(void **)(in_RDI + 0x118);
  }
  memset(__s,0,0x438);
  for (local_c = 0; local_c < 0x14; local_c = local_c + 1) {
    *(void **)((long)__s + (long)local_c * 0x30 + 0x20) = (void *)((long)__s + (long)local_c * 0x30)
    ;
    *(void **)((long)__s + (long)local_c * 0x30 + 0x28) = (void *)((long)__s + (long)local_c * 0x30)
    ;
  }
  *(void **)(in_RDI + 0x118) = __s;
  *(undefined8 *)(in_RDI + 0x120) = 0;
  return;
}

Assistant:

static void set_thr_data(kmp_info_t *th) {
  int i;
  thr_data_t *data;

  data = (thr_data_t *)((!th->th.th_local.bget_data)
                            ? __kmp_allocate(sizeof(*data))
                            : th->th.th_local.bget_data);

  memset(data, '\0', sizeof(*data));

  for (i = 0; i < MAX_BGET_BINS; ++i) {
    data->freelist[i].ql.flink = &data->freelist[i];
    data->freelist[i].ql.blink = &data->freelist[i];
  }

  th->th.th_local.bget_data = data;
  th->th.th_local.bget_list = 0;
#if !USE_CMP_XCHG_FOR_BGET
#ifdef USE_QUEUING_LOCK_FOR_BGET
  __kmp_init_lock(&th->th.th_local.bget_lock);
#else
  __kmp_init_bootstrap_lock(&th->th.th_local.bget_lock);
#endif /* USE_LOCK_FOR_BGET */
#endif /* ! USE_CMP_XCHG_FOR_BGET */
}